

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

void getLpColBounds(HighsLp *lp,HighsInt from_col,HighsInt to_col,double *XcolLower,
                   double *XcolUpper)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  
  if (from_col <= to_col) {
    pdVar1 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = 0;
    do {
      if (XcolLower != (double *)0x0) {
        XcolLower[lVar3] = pdVar2[from_col + lVar3];
      }
      if (XcolUpper != (double *)0x0) {
        XcolUpper[lVar3] = pdVar1[from_col + lVar3];
      }
      lVar3 = lVar3 + 1;
    } while ((to_col - from_col) + 1 != (int)lVar3);
  }
  return;
}

Assistant:

void getLpColBounds(const HighsLp& lp, const HighsInt from_col,
                    const HighsInt to_col, double* XcolLower,
                    double* XcolUpper) {
  assert(0 <= from_col && from_col < lp.num_col_);
  assert(0 <= to_col && to_col < lp.num_col_);
  if (from_col > to_col) return;
  for (HighsInt col = from_col; col < to_col + 1; col++) {
    if (XcolLower != nullptr) XcolLower[col - from_col] = lp.col_lower_[col];
    if (XcolUpper != nullptr) XcolUpper[col - from_col] = lp.col_upper_[col];
  }
}